

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O3

void __thiscall Clipper::DoRemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  uint uVar1;
  uint uVar2;
  ClipNode *pCVar3;
  ClipNode *p;
  ClipNode *pCVar4;
  ClipNode *pCVar5;
  ClipNode *pCVar6;
  
  pCVar4 = this->cliphead;
  pCVar5 = pCVar4;
  if (pCVar4 != (ClipNode *)0x0) {
    do {
      if (end <= pCVar5->start) break;
      if ((pCVar5->start < start) || (end < pCVar5->end)) {
        pCVar6 = pCVar5->next;
      }
      else {
        pCVar6 = pCVar5->next;
        if (pCVar4 == pCVar5) {
          pCVar4 = pCVar4->next;
          this->cliphead = pCVar4;
        }
        else {
          pCVar3 = pCVar5->prev;
          if (pCVar3 != (ClipNode *)0x0) {
            pCVar3->next = pCVar6;
          }
          if (pCVar6 != (ClipNode *)0x0) {
            pCVar6->prev = pCVar3;
          }
        }
        pCVar5->next = ClipNode::freelist;
        ClipNode::freelist = pCVar5;
      }
      pCVar5 = pCVar6;
    } while (pCVar6 != (ClipNode *)0x0);
    for (pCVar4 = this->cliphead; pCVar4 != (ClipNode *)0x0; pCVar4 = pCVar4->next) {
      uVar1 = pCVar4->start;
      if (uVar1 <= end && start <= uVar1) {
        pCVar4->start = end;
        return;
      }
      uVar2 = pCVar4->end;
      if (end < uVar2 || uVar2 < start) {
        if (uVar1 < start && end < uVar2) {
          if (ClipNode::freelist == (ClipNode *)0x0) {
            pCVar5 = (ClipNode *)operator_new(0x18);
          }
          else {
            pCVar5 = ClipNode::freelist;
            ClipNode::freelist = ClipNode::freelist->next;
          }
          pCVar5->start = end;
          pCVar5->end = uVar2;
          pCVar5->prev = (ClipNode *)0x0;
          pCVar5->next = (ClipNode *)0x0;
          pCVar4->end = start;
          pCVar5->next = pCVar4->next;
          pCVar5->prev = pCVar4;
          pCVar4->next = pCVar5;
          if (pCVar5->next == (ClipNode *)0x0) {
            return;
          }
          pCVar5->next->prev = pCVar5;
          return;
        }
      }
      else {
        pCVar4->end = start;
      }
    }
  }
  return;
}

Assistant:

void Clipper::DoRemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node, *temp;

	if (cliphead)
	{
		//check to see if range contains any old ranges
		node = cliphead;
		while (node != NULL && node->start < end)
		{
			if (node->start >= start && node->end <= end)
			{
				temp = node;
				node = node->next;
				RemoveRange(temp);
			}
			else
			{
				node = node->next;
			}
		}
		
		//check to see if range overlaps a range (or possibly 2)
		node = cliphead;
		while (node != NULL)
		{
			if (node->start >= start && node->start <= end)
			{
				node->start = end;
				break;
			}
			else if (node->end >= start && node->end <= end)
			{
				node->end=start;
			}
			else if (node->start < start && node->end > end)
			{
				temp=ClipNode::NewRange(end, node->end);
				node->end=start;
				temp->next=node->next;
				temp->prev=node;
				node->next=temp;
				if (temp->next) temp->next->prev=temp;
				break;
			}
			node = node->next;
		}
	}
}